

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Swapchain.cpp
# Opt level: O1

Ptr<Swapchain> __thiscall
myvk::Swapchain::Create
          (Swapchain *this,Ptr<Queue> *graphics_queue,Ptr<PresentQueue> *present_queue,
          bool use_vsync,VkImageUsageFlags image_usage)

{
  VkPhysicalDevice pVVar1;
  VkSurfaceKHR pVVar2;
  VkPresentModeKHR *pVVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  PFN_vkCreateSwapchainKHR p_Var5;
  PFN_vkGetSwapchainImagesKHR p_Var6;
  element_type *peVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var8;
  int iVar9;
  VkResult VVar10;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined7 in_register_00000009;
  VkPresentModeKHR *pVVar11;
  long lVar12;
  uint uVar13;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var14;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  VkPresentModeKHR VVar15;
  VkColorSpaceKHR VVar16;
  VkSwapchainCreateInfoKHR *pVVar17;
  _func_int **pp_Var18;
  VkFormat VVar19;
  bool bVar20;
  byte bVar21;
  Ptr<Swapchain> PVar22;
  uint32_t present_mode_count;
  uint32_t format_count;
  shared_ptr<myvk::Swapchain> ret;
  vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_> present_modes;
  vector<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_> surface_formats;
  int height;
  VkSwapchainCreateInfoKHR create_info;
  VkSurfaceCapabilitiesKHR capabilities;
  uint local_150;
  uint local_14c;
  _func_int **local_148;
  element_type *peStack_140;
  VkImageUsageFlags local_130;
  undefined4 local_12c;
  vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_> local_128;
  vector<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_> local_108;
  Swapchain *local_e8;
  uint local_e0 [2];
  VkSwapchainCreateInfoKHR local_d8;
  VkSurfaceCapabilitiesKHR local_64;
  
  bVar21 = 0;
  local_12c = (undefined4)CONCAT71(in_register_00000009,use_vsync);
  std::__shared_ptr<myvk::Swapchain,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<myvk::Swapchain>>
            ((__shared_ptr<myvk::Swapchain,(__gnu_cxx::_Lock_policy)2> *)&local_148,
             (allocator<myvk::Swapchain> *)&local_d8);
  local_148[3] = (_func_int *)
                 (graphics_queue->super___shared_ptr<myvk::Queue,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_148 + 4),
             &(graphics_queue->super___shared_ptr<myvk::Queue,_(__gnu_cxx::_Lock_policy)2>).
              _M_refcount);
  local_148[5] = (_func_int *)
                 (present_queue->super___shared_ptr<myvk::PresentQueue,_(__gnu_cxx::_Lock_policy)2>)
                 ._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_148 + 6),
             &(present_queue->super___shared_ptr<myvk::PresentQueue,_(__gnu_cxx::_Lock_policy)2>).
              _M_refcount);
  iVar9 = (*(((graphics_queue->super___shared_ptr<myvk::Queue,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
            ->super_DeviceObjectBase).super_Base._vptr_Base[2])();
  pVVar1 = *(VkPhysicalDevice *)(*(long *)(*(long *)CONCAT44(extraout_var,iVar9) + 0x18) + 0x28);
  pVVar2 = ((((present_queue->super___shared_ptr<myvk::PresentQueue,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr)->m_surface_ptr).super___shared_ptr<myvk::Surface,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr)->m_surface;
  local_108.super__Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_108.super__Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_108.super__Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_128.super__Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_128.super__Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>._M_impl.
  super__Vector_impl_data._M_start = (VkPresentModeKHR *)0x0;
  local_128.super__Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>._M_impl.
  super__Vector_impl_data._M_finish = (VkPresentModeKHR *)0x0;
  local_130 = image_usage;
  (*vkGetPhysicalDeviceSurfaceCapabilitiesKHR)(pVVar1,pVVar2,&local_64);
  (*vkGetPhysicalDeviceSurfaceFormatsKHR)(pVVar1,pVVar2,&local_14c,(VkSurfaceFormatKHR *)0x0);
  if ((ulong)local_14c != 0) {
    std::vector<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>::resize
              (&local_108,(ulong)local_14c);
    (*vkGetPhysicalDeviceSurfaceFormatsKHR)
              (pVVar1,pVVar2,&local_14c,
               local_108.super__Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>
               ._M_impl.super__Vector_impl_data._M_start);
  }
  (*vkGetPhysicalDeviceSurfacePresentModesKHR)(pVVar1,pVVar2,&local_150,(VkPresentModeKHR *)0x0);
  if ((ulong)local_150 != 0) {
    std::vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>::resize
              (&local_128,(ulong)local_150);
    (*vkGetPhysicalDeviceSurfacePresentModesKHR)
              (pVVar1,pVVar2,&local_150,
               local_128.super__Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>.
               _M_impl.super__Vector_impl_data._M_start);
  }
  _Var14._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_108.
                 super__Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>._M_impl
                 .super__Vector_impl_data._M_finish;
  if ((local_108.super__Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>._M_impl
       .super__Vector_impl_data._M_start !=
       local_108.super__Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>._M_impl
       .super__Vector_impl_data._M_finish) &&
     (local_128.super__Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_128.super__Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>._M_impl.
      super__Vector_impl_data._M_finish)) {
    VVar19 = (local_108.super__Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>.
              _M_impl.super__Vector_impl_data._M_start)->format;
    VVar16 = *(VkColorSpaceKHR *)
              ((long)&(local_108.
                       super__Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>.
                       _M_impl.super__Vector_impl_data._M_start)->format + 4);
    p_Var8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             local_108.super__Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((long)local_108.super__Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)local_108.super__Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>.
              _M_impl.super__Vector_impl_data._M_start == 8 && VVar19 == VK_FORMAT_UNDEFINED) {
      VVar19 = VK_FORMAT_B8G8R8A8_UNORM;
    }
    else {
      do {
        p_Var4 = p_Var8;
        if (p_Var4 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                      local_108.
                      super__Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>.
                      _M_impl.super__Vector_impl_data._M_finish) goto LAB_001a7e80;
        p_Var8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&p_Var4->_M_use_count;
      } while (*(int *)&p_Var4->_vptr__Sp_counted_base != 0x2c);
      VVar16 = *(VkColorSpaceKHR *)((long)&p_Var4->_vptr__Sp_counted_base + 4);
      VVar19 = VK_FORMAT_B8G8R8A8_UNORM;
    }
LAB_001a7e80:
    VVar15 = VK_PRESENT_MODE_FIFO_KHR;
    if ((char)local_12c == '\0') {
      if (local_128.super__Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>._M_impl.
          super__Vector_impl_data._M_start ==
          local_128.super__Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        VVar15 = VK_PRESENT_MODE_IMMEDIATE_KHR;
      }
      else {
        VVar15 = VK_PRESENT_MODE_IMMEDIATE_KHR;
        pVVar3 = local_128.super__Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        do {
          pVVar11 = pVVar3 + 1;
          if (*pVVar3 == VK_PRESENT_MODE_MAILBOX_KHR) {
            VVar15 = VK_PRESENT_MODE_MAILBOX_KHR;
            break;
          }
          pVVar3 = pVVar11;
        } while (pVVar11 !=
                 local_128.super__Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>.
                 _M_impl.super__Vector_impl_data._M_finish);
      }
    }
    local_e8 = this;
    if (local_64.currentExtent.width == ~VK_STRUCTURE_TYPE_APPLICATION_INFO) {
      glfwGetWindowSize(((((present_queue->
                           super___shared_ptr<myvk::PresentQueue,_(__gnu_cxx::_Lock_policy)2>).
                          _M_ptr)->m_surface_ptr).
                         super___shared_ptr<myvk::Surface,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                        m_window,(int *)&local_d8,(int *)local_e0);
      local_64.currentExtent.width = local_64.maxImageExtent.width;
      if (local_d8.sType < local_64.maxImageExtent.width) {
        local_64.currentExtent.width = local_d8.sType;
      }
      if (local_64.currentExtent.width < local_64.minImageExtent.width) {
        local_64.currentExtent.width = local_64.minImageExtent.width;
      }
      if (local_e0[0] < local_64.maxImageExtent.height) {
        local_64.maxImageExtent.height = local_e0[0];
      }
      local_64.currentExtent.height = local_64.maxImageExtent.height;
      if (local_64.maxImageExtent.height < local_64.minImageExtent.height) {
        local_64.currentExtent.height = local_64.minImageExtent.height;
      }
    }
    this = local_e8;
    uVar13 = local_64.minImageCount + 1;
    local_d8.minImageCount = local_64.maxImageCount;
    if (uVar13 < local_64.maxImageCount) {
      local_d8.minImageCount = uVar13;
    }
    if (local_64.maxImageCount == 0) {
      local_d8.minImageCount = uVar13;
    }
    local_d8.pNext = (void *)0x0;
    local_d8.flags = 0;
    local_d8._20_4_ = 0;
    local_d8._68_4_ = 0;
    local_d8.sType = VK_STRUCTURE_TYPE_SWAPCHAIN_CREATE_INFO_KHR;
    local_d8._4_4_ = 0;
    local_d8.surface = pVVar2;
    local_d8.imageFormat = VVar19;
    local_d8.imageExtent.width = local_64.currentExtent.width;
    local_d8.imageColorSpace = VVar16;
    local_d8.imageArrayLayers = 1;
    local_d8.imageExtent.height = local_64.currentExtent.height;
    local_d8.imageUsage = local_130;
    bVar20 = ((((present_queue->super___shared_ptr<myvk::PresentQueue,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr)->super_Queue).m_unique_queue_ptr.
              super___shared_ptr<myvk::UniqueQueue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             m_family_index !=
             ((((graphics_queue->super___shared_ptr<myvk::Queue,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
               )->m_unique_queue_ptr).
              super___shared_ptr<myvk::UniqueQueue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             m_family_index;
    if (bVar20) {
      local_d8.imageSharingMode = VK_SHARING_MODE_CONCURRENT;
      local_d8.queueFamilyIndexCount = 2;
      local_d8.pQueueFamilyIndices = local_e0;
    }
    else {
      local_d8.pQueueFamilyIndices = (uint *)0x0;
      local_d8.imageSharingMode = VK_SHARING_MODE_EXCLUSIVE;
      local_d8.queueFamilyIndexCount = 0;
    }
    local_d8.imageSharingMode = (VkSharingMode)bVar20;
    local_d8.compositeAlpha = VK_COMPOSITE_ALPHA_OPAQUE_BIT_KHR;
    local_d8.preTransform = local_64.currentTransform;
    local_d8.clipped = 1;
    local_d8.presentMode = VVar15;
    local_d8.oldSwapchain = (VkSwapchainKHR)0x0;
    pVVar17 = &local_d8;
    pp_Var18 = local_148 + 8;
    for (lVar12 = 0xd; p_Var5 = vkCreateSwapchainKHR, lVar12 != 0; lVar12 = lVar12 + -1) {
      *pp_Var18 = *(_func_int **)pVVar17;
      pVVar17 = (VkSwapchainCreateInfoKHR *)((long)pVVar17 + ((ulong)bVar21 * -2 + 1) * 8);
      pp_Var18 = pp_Var18 + (ulong)bVar21 * -2 + 1;
    }
    iVar9 = (*(((graphics_queue->super___shared_ptr<myvk::Queue,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
               )->super_DeviceObjectBase).super_Base._vptr_Base[2])();
    VVar10 = (*p_Var5)(*(VkDevice *)(*(long *)CONCAT44(extraout_var_00,iVar9) + 0x268),&local_d8,
                       (VkAllocationCallbacks *)0x0,(VkSwapchainKHR *)(local_148 + 7));
    p_Var6 = vkGetSwapchainImagesKHR;
    _Var14._M_pi = extraout_RDX;
    if (VVar10 == VK_SUCCESS) {
      iVar9 = (*(((graphics_queue->super___shared_ptr<myvk::Queue,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr)->super_DeviceObjectBase).super_Base._vptr_Base[2])();
      (*p_Var6)(*(VkDevice *)(*(long *)CONCAT44(extraout_var_01,iVar9) + 0x268),
                (VkSwapchainKHR)local_148[7],(uint32_t *)(local_148 + 0x15),(VkImage *)0x0);
      peVar7 = peStack_140;
      (this->super_DeviceObjectBase).super_Base.super_enable_shared_from_this<myvk::Base>.
      _M_weak_this.super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      peStack_140 = (element_type *)0x0;
      (this->super_DeviceObjectBase).super_Base._vptr_Base = local_148;
      (this->super_DeviceObjectBase).super_Base.super_enable_shared_from_this<myvk::Base>.
      _M_weak_this.super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar7;
      local_148 = (_func_int **)0x0;
      _Var14._M_pi = extraout_RDX_03;
      goto LAB_001a8084;
    }
  }
  (this->super_DeviceObjectBase).super_Base._vptr_Base = (_func_int **)0x0;
  (this->super_DeviceObjectBase).super_Base.super_enable_shared_from_this<myvk::Base>._M_weak_this.
  super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
LAB_001a8084:
  if (local_128.super__Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>._M_impl.
      super__Vector_impl_data._M_start != (VkPresentModeKHR *)0x0) {
    operator_delete(local_128.
                    super__Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_128.
                          super__Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_128.
                          super__Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>.
                          _M_impl.super__Vector_impl_data._M_start);
    _Var14._M_pi = extraout_RDX_00;
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_108.super__Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>._M_impl.
      super__Vector_impl_data._M_start != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    operator_delete(local_108.
                    super__Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_108.
                          super__Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_108.
                          super__Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>
                          ._M_impl.super__Vector_impl_data._M_start);
    _Var14._M_pi = extraout_RDX_01;
  }
  if (peStack_140 != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peStack_140);
    _Var14._M_pi = extraout_RDX_02;
  }
  PVar22.super___shared_ptr<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var14._M_pi;
  PVar22.super___shared_ptr<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (Ptr<Swapchain>)PVar22.super___shared_ptr<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Ptr<Swapchain> Swapchain::Create(const Ptr<Queue> &graphics_queue, const Ptr<PresentQueue> &present_queue,
                                 bool use_vsync, VkImageUsageFlags image_usage) {
	auto ret = std::make_shared<Swapchain>();
	ret->m_graphics_queue_ptr = graphics_queue;
	ret->m_present_queue_ptr = present_queue;

	VkPhysicalDevice physical_device = graphics_queue->GetDevicePtr()->GetPhysicalDevicePtr()->GetHandle();
	VkSurfaceKHR surface = present_queue->GetSurfacePtr()->GetHandle();

	VkSurfaceCapabilitiesKHR capabilities;
	std::vector<VkSurfaceFormatKHR> surface_formats;
	std::vector<VkPresentModeKHR> present_modes;

	vkGetPhysicalDeviceSurfaceCapabilitiesKHR(physical_device, surface, &capabilities);

	uint32_t format_count;
	vkGetPhysicalDeviceSurfaceFormatsKHR(physical_device, surface, &format_count, nullptr);
	if (format_count != 0) {
		surface_formats.resize(format_count);
		vkGetPhysicalDeviceSurfaceFormatsKHR(physical_device, surface, &format_count, surface_formats.data());
	}
	uint32_t present_mode_count;
	vkGetPhysicalDeviceSurfacePresentModesKHR(physical_device, surface, &present_mode_count, nullptr);
	if (present_mode_count != 0) {
		present_modes.resize(present_mode_count);
		vkGetPhysicalDeviceSurfacePresentModesKHR(physical_device, surface, &present_mode_count, present_modes.data());
	}
	if (surface_formats.empty() || present_modes.empty())
		return nullptr;

	// select surface format
	VkSurfaceFormatKHR surface_format = surface_formats.front();
	if (surface_formats.size() == 1 && surface_formats.front().format == VK_FORMAT_UNDEFINED)
		surface_format.format = VK_FORMAT_B8G8R8A8_UNORM;
	else {
		for (const auto &i : surface_formats)
			if (i.format == VK_FORMAT_B8G8R8A8_UNORM) {
				surface_format = i;
				break;
			}
	}

	// select present mode
	VkPresentModeKHR present_mode = VK_PRESENT_MODE_FIFO_KHR;
	if (!use_vsync) {
		present_mode = VK_PRESENT_MODE_IMMEDIATE_KHR;
		for (const auto &i : present_modes)
			if (i == VK_PRESENT_MODE_MAILBOX_KHR) {
				present_mode = i;
				break;
			}
	}

	// query extent
	VkExtent2D extent = capabilities.currentExtent;
	if (capabilities.currentExtent.width == UINT32_MAX) {
		int width, height;
		glfwGetWindowSize(present_queue->GetSurfacePtr()->GetGlfwWindow(), &width, &height);
		extent = {(uint32_t)width, (uint32_t)height};

		extent.width =
		    std::max(capabilities.minImageExtent.width, std::min(capabilities.maxImageExtent.width, extent.width));
		extent.height =
		    std::max(capabilities.minImageExtent.height, std::min(capabilities.maxImageExtent.height, extent.height));
	}

	// query image count
	uint32_t image_count = capabilities.minImageCount + 1u;
	if (capabilities.maxImageCount > 0 && image_count > capabilities.maxImageCount)
		image_count = capabilities.maxImageCount;

	// create swapchain
	VkSwapchainCreateInfoKHR create_info = {};
	create_info.sType = VK_STRUCTURE_TYPE_SWAPCHAIN_CREATE_INFO_KHR;
	create_info.surface = surface;
	create_info.minImageCount = image_count;
	create_info.imageFormat = surface_format.format;
	create_info.imageColorSpace = surface_format.colorSpace;
	create_info.imageExtent = extent;
	create_info.imageArrayLayers = 1;
	create_info.imageUsage = image_usage;

	if (present_queue->GetFamilyIndex() != graphics_queue->GetFamilyIndex()) {
		uint32_t queue_family_indices[] = {graphics_queue->GetFamilyIndex(), present_queue->GetFamilyIndex()};
		create_info.imageSharingMode = VK_SHARING_MODE_CONCURRENT;
		create_info.queueFamilyIndexCount = 2;
		create_info.pQueueFamilyIndices = queue_family_indices;
	} else {
		create_info.imageSharingMode = VK_SHARING_MODE_EXCLUSIVE;
		create_info.queueFamilyIndexCount = 0;
		create_info.pQueueFamilyIndices = nullptr;
	}
	create_info.preTransform = capabilities.currentTransform;
	create_info.compositeAlpha = VK_COMPOSITE_ALPHA_OPAQUE_BIT_KHR;
	create_info.presentMode = present_mode;
	create_info.clipped = VK_TRUE;
	create_info.oldSwapchain = VK_NULL_HANDLE;

	// set constants
	ret->m_swapchain_create_info = create_info;

	if (vkCreateSwapchainKHR(graphics_queue->GetDevicePtr()->GetHandle(), &create_info, nullptr, &ret->m_swapchain) !=
	    VK_SUCCESS)
		return nullptr;

	// get image count
	vkGetSwapchainImagesKHR(graphics_queue->GetDevicePtr()->GetHandle(), ret->m_swapchain, &ret->m_image_count,
	                        nullptr);

	return ret;
}